

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::Type::BasicType> * __thiscall
wasm::Random::FeatureOptions<wasm::Type::BasicType>::add<>
          (FeatureOptions<wasm::Type::BasicType> *this,FeatureSet feature,BasicType option)

{
  iterator __position;
  vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *this_00;
  key_type local_18;
  BasicType local_14;
  FeatureSet feature_local;
  BasicType option_local;
  
  local_18.features = feature.features;
  local_14 = option;
  this_00 = (vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
            ::operator[](&this->options,&local_18);
  __position._M_current = *(BasicType **)(this_00 + 8);
  if (__position._M_current == *(BasicType **)(this_00 + 0x10)) {
    std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>::
    _M_realloc_insert<wasm::Type::BasicType_const&>(this_00,__position,&local_14);
  }
  else {
    *__position._M_current = local_14;
    *(BasicType **)(this_00 + 8) = __position._M_current + 1;
  }
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }